

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

SUNErrCode SUNSparseMatrix_ToCSC(SUNMatrix A,SUNMatrix *Bout)

{
  SUNMatrix p_Var1;
  undefined8 *in_RSI;
  SUNContext_conflict sunctx_local_scope_;
  sunindextype in_stack_00000018;
  sunindextype in_stack_00000020;
  SUNMatrix in_stack_00000090;
  SUNMatrix in_stack_00000098;
  
  p_Var1 = SUNSparseMatrix(in_stack_00000020,in_stack_00000018,(sunindextype)A,Bout._4_4_,
                           sunctx_local_scope_);
  *in_RSI = p_Var1;
  format_convert(in_stack_00000098,in_stack_00000090);
  return 0;
}

Assistant:

SUNErrCode SUNSparseMatrix_ToCSC(const SUNMatrix A, SUNMatrix* Bout)
{
  SUNFunctionBegin(A->sunctx);
  SUNAssert(SUNMatGetID(A) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(SM_SPARSETYPE_S(A) == CSR_MAT, SUN_ERR_ARG_OUTOFRANGE);

  *Bout = SUNSparseMatrix(SM_ROWS_S(A), SM_COLUMNS_S(A), SM_NNZ_S(A), CSC_MAT,
                          A->sunctx);
  SUNCheckLastErr();

  SUNCheckCall(format_convert(A, *Bout));
  return SUN_SUCCESS;
}